

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

void __thiscall FailableMemoryAllocator::failAllocNumber(FailableMemoryAllocator *this,int number)

{
  char *pcVar1;
  undefined4 in_ESI;
  LocationToFailAllocNode *in_RDI;
  LocationToFailAllocNode *newNode;
  undefined4 in_stack_fffffffffffffff0;
  
  pcVar1 = (char *)(**(code **)(*(long *)in_RDI + 0x40))(in_RDI,0x20);
  LocationToFailAllocNode::failAtAllocNumber
            ((LocationToFailAllocNode *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (int)((ulong)pcVar1 >> 0x20),in_RDI);
  in_RDI[1].file_ = pcVar1;
  return;
}

Assistant:

void FailableMemoryAllocator::failAllocNumber(int number)
{
    LocationToFailAllocNode* newNode = (LocationToFailAllocNode*) (void*) allocMemoryLeakNode(sizeof(LocationToFailAllocNode));
    newNode->failAtAllocNumber(number, head_);
    head_ = newNode;
}